

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O1

int Gia_ManAreDeriveNexts_rec(Gia_ManAre_t *p,Gia_PtrAre_t Sta)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int *piVar3;
  void *pvVar4;
  int iVar5;
  uint uVar6;
  Gia_Man_t *pGVar7;
  Gia_Obj_t *pGVar8;
  ulong uVar9;
  Gia_StaAre_t *pSta;
  long lVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  timespec ts;
  timespec local_40;
  
  iVar5 = p->nRecCalls + 1;
  p->nRecCalls = iVar5;
  if (iVar5 == 1000000) {
    return 0;
  }
  pGVar7 = p->pNew;
  lVar10 = (long)pGVar7->vCis->nSize;
  if (0 < lVar10) {
    piVar3 = pGVar7->vCis->pArray;
    lVar13 = 0;
    do {
      iVar5 = piVar3[lVar13];
      if (((long)iVar5 < 0) || (pGVar7->nObjs <= iVar5)) goto LAB_006ce85a;
      if (pGVar7->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar7->pObjs[iVar5].Value = 0;
      lVar13 = lVar13 + 1;
    } while (lVar10 != lVar13);
  }
  pGVar7 = p->pAig;
  iVar5 = pGVar7->nRegs;
  if (0 < iVar5) {
    iVar11 = 0;
    do {
      iVar2 = pGVar7->vCos->nSize;
      uVar12 = (iVar2 - iVar5) + iVar11;
      if (((int)uVar12 < 0) || (iVar2 <= (int)uVar12)) goto LAB_006ce879;
      iVar5 = pGVar7->vCos->pArray[uVar12];
      lVar10 = (long)iVar5;
      if ((lVar10 < 0) || (pGVar7->nObjs <= iVar5)) goto LAB_006ce85a;
      pGVar8 = pGVar7->pObjs;
      if (pGVar8 == (Gia_Obj_t *)0x0) break;
      if (1 < pGVar8[lVar10].Value) {
        Gia_ManIncrementTravId(p->pNew);
        if ((int)pGVar8[lVar10].Value < 0) goto LAB_006ce8b7;
        pGVar7 = p->pNew;
        uVar12 = pGVar8[lVar10].Value >> 1;
        if (pGVar7->nObjs <= (int)uVar12) goto LAB_006ce85a;
        Gia_ManAreMostUsedPi_rec(pGVar7,pGVar7->pObjs + uVar12);
      }
      iVar11 = iVar11 + 1;
      pGVar7 = p->pAig;
      iVar5 = pGVar7->nRegs;
    } while (iVar11 < iVar5);
  }
  pGVar7 = p->pNew;
  uVar14 = 0;
  pGVar8 = (Gia_Obj_t *)0x0;
  do {
    iVar5 = pGVar7->vCis->pArray[uVar14];
    if (((long)iVar5 < 0) || (pGVar7->nObjs <= iVar5)) goto LAB_006ce85a;
    if (pGVar7->pObjs == (Gia_Obj_t *)0x0) break;
    pGVar1 = pGVar7->pObjs + iVar5;
    if ((pGVar8 == (Gia_Obj_t *)0x0) || (pGVar8->Value < pGVar1->Value)) {
      pGVar8 = pGVar1;
    }
    uVar14 = uVar14 + 1;
  } while ((uint)pGVar7->vCis->nSize != uVar14);
  if ((pGVar8 != (Gia_Obj_t *)0x0) && (1 < pGVar8->Value)) {
    if (-1 < (int)*(undefined8 *)pGVar8) {
      __assert_fail("pObj->fTerm",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1b8,"int Gia_ObjCioId(Gia_Obj_t *)");
    }
    uVar12 = (uint)((ulong)*(undefined8 *)pGVar8 >> 0x20);
    if ((p->vCiTfos->nSize <= (int)(uVar12 & 0x1fffffff)) ||
       (p->vCiLits->nSize <= (int)(uVar12 & 0x1fffffff))) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                    ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
    }
    lVar10 = *(long *)((long)p->vCiTfos->pArray + (ulong)(uVar12 << 3));
    pvVar4 = p->vCiLits->pArray[uVar12 & 0x1fffffff];
    if (*(int *)(lVar10 + 4) != *(int *)((long)pvVar4 + 4)) {
      __assert_fail("Vec_IntSize(vTfos) == Vec_IntSize(vLits)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                    ,0x622,"int Gia_ManAreDeriveNexts_rec(Gia_ManAre_t *, Gia_PtrAre_t)");
    }
    if (0 < *(int *)(lVar10 + 4)) {
      lVar13 = 0;
      do {
        iVar5 = *(int *)(*(long *)(lVar10 + 8) + lVar13 * 4);
        if (((long)iVar5 < 0) || (p->pAig->nObjs <= iVar5)) goto LAB_006ce85a;
        pGVar8 = p->pAig->pObjs;
        if (pGVar8 == (Gia_Obj_t *)0x0) break;
        if (*(int *)((long)pvVar4 + 4) <= lVar13) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pGVar8 = pGVar8 + iVar5;
        *(uint *)(*(long *)((long)pvVar4 + 8) + lVar13 * 4) = pGVar8->Value;
        uVar14 = *(ulong *)pGVar8;
        uVar12 = (uint)uVar14;
        uVar9 = uVar14 & 0x1fffffff;
        if (uVar9 == 0x1fffffff || (int)uVar12 < 0) {
          if ((int)uVar12 < 0 && (int)uVar9 != 0x1fffffff) {
            if ((int)pGVar8[-uVar9].Value < 0) goto LAB_006ce898;
            uVar6 = pGVar8[-uVar9].Value ^ uVar12 >> 0x1d & 1;
          }
          else {
            uVar6 = 0;
            if ((uVar12 & 0x9fffffff) != 0x9fffffff) {
              __assert_fail("Gia_ObjIsCi(pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                            ,0x62c,"int Gia_ManAreDeriveNexts_rec(Gia_ManAre_t *, Gia_PtrAre_t)");
            }
          }
        }
        else {
          if ((int)pGVar8[-uVar9].Value < 0) goto LAB_006ce898;
          uVar12 = (uint)(uVar14 >> 0x20);
          if ((int)pGVar8[-(ulong)(uVar12 & 0x1fffffff)].Value < 0) goto LAB_006ce898;
          uVar6 = Gia_ManHashAnd(p->pNew,pGVar8[-uVar9].Value ^ (uint)(uVar14 >> 0x1d) & 1,
                                 pGVar8[-(ulong)(uVar12 & 0x1fffffff)].Value ^ uVar12 >> 0x1d & 1);
        }
        pGVar8->Value = uVar6;
        lVar13 = lVar13 + 1;
      } while (lVar13 < *(int *)(lVar10 + 4));
    }
    iVar5 = Gia_ManAreDeriveNexts_rec(p,Sta);
    if (iVar5 != 0) {
      return 1;
    }
    if (0 < *(int *)(lVar10 + 4)) {
      lVar13 = 0;
      do {
        iVar5 = *(int *)(*(long *)(lVar10 + 8) + lVar13 * 4);
        if (((long)iVar5 < 0) || (p->pAig->nObjs <= iVar5)) goto LAB_006ce85a;
        pGVar8 = p->pAig->pObjs;
        if (pGVar8 == (Gia_Obj_t *)0x0) break;
        pGVar8 = pGVar8 + iVar5;
        uVar14 = *(ulong *)pGVar8;
        uVar12 = (uint)uVar14;
        uVar9 = uVar14 & 0x1fffffff;
        if (uVar9 == 0x1fffffff || (int)uVar12 < 0) {
          if ((int)uVar12 < 0 && (int)uVar9 != 0x1fffffff) {
            if ((int)pGVar8[-uVar9].Value < 0) goto LAB_006ce898;
            uVar6 = pGVar8[-uVar9].Value ^ uVar12 >> 0x1d & 1;
          }
          else {
            uVar6 = 1;
            if ((uVar12 & 0x9fffffff) != 0x9fffffff) {
              __assert_fail("Gia_ObjIsCi(pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                            ,0x63b,"int Gia_ManAreDeriveNexts_rec(Gia_ManAre_t *, Gia_PtrAre_t)");
            }
          }
        }
        else {
          if ((int)pGVar8[-uVar9].Value < 0) {
LAB_006ce898:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf5,"int Abc_LitNotCond(int, int)");
          }
          uVar12 = (uint)(uVar14 >> 0x20);
          if ((int)pGVar8[-(ulong)(uVar12 & 0x1fffffff)].Value < 0) goto LAB_006ce898;
          uVar6 = Gia_ManHashAnd(p->pNew,pGVar8[-uVar9].Value ^ (uint)(uVar14 >> 0x1d) & 1,
                                 pGVar8[-(ulong)(uVar12 & 0x1fffffff)].Value ^ uVar12 >> 0x1d & 1);
        }
        pGVar8->Value = uVar6;
        lVar13 = lVar13 + 1;
      } while (lVar13 < *(int *)(lVar10 + 4));
    }
    iVar5 = Gia_ManAreDeriveNexts_rec(p,Sta);
    if (iVar5 != 0) {
      return 1;
    }
    iVar5 = *(int *)(lVar10 + 4);
    if ((long)iVar5 < 1) {
      return 0;
    }
    pGVar7 = p->pAig;
    lVar10 = *(long *)(lVar10 + 8);
    lVar13 = 0;
    while( true ) {
      iVar11 = *(int *)(lVar10 + lVar13 * 4);
      if (((long)iVar11 < 0) || (pGVar7->nObjs <= iVar11)) break;
      pGVar8 = pGVar7->pObjs;
      if (pGVar8 == (Gia_Obj_t *)0x0) {
        return 0;
      }
      if (*(int *)((long)pvVar4 + 4) <= lVar13) goto LAB_006ce879;
      pGVar8[iVar11].Value = *(uint *)(*(long *)((long)pvVar4 + 8) + lVar13 * 4);
      lVar13 = lVar13 + 1;
      if (iVar5 == lVar13) {
        return 0;
      }
    }
LAB_006ce85a:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  iVar5 = clock_gettime(3,&local_40);
  if (iVar5 < 0) {
    iVar5 = 1;
  }
  else {
    iVar5 = ((int)(SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8) >> 7) -
            (SUB164(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),0xc) >> 0x1f)) +
            (int)local_40.tv_sec * -1000000;
  }
  pSta = Gia_ManAreCreateStaNew(p);
  pSta->iPrev = Sta;
  if (p->fMiter != 0) {
    pGVar7 = p->pAig;
    uVar12 = pGVar7->vCos->nSize;
    uVar14 = 0;
    iVar11 = 0;
    uVar6 = uVar12 - pGVar7->nRegs;
    if (uVar6 == 0 || (int)uVar12 < pGVar7->nRegs) goto LAB_006ce7b7;
    uVar9 = (ulong)uVar12;
    if ((int)uVar12 < 1) {
      uVar9 = uVar14;
    }
    do {
      if (uVar9 == uVar14) {
LAB_006ce879:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar11 = pGVar7->vCos->pArray[uVar14];
      if (((long)iVar11 < 0) || (pGVar7->nObjs <= iVar11)) goto LAB_006ce85a;
      if (pGVar7->pObjs == (Gia_Obj_t *)0x0) break;
      uVar12 = pGVar7->pObjs[iVar11].Value;
      if ((int)uVar12 < 0) {
LAB_006ce8b7:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf2,"int Abc_Lit2Var(int)");
      }
      if (p->pNew->nObjs <= (int)(uVar12 >> 1)) goto LAB_006ce85a;
      if (((~*(ulong *)(p->pNew->pObjs + (uVar12 >> 1)) & 0x1fffffff1fffffff) != 0) ||
         ((uVar12 & 1) != 0)) {
        p->iOutFail = (int)uVar14;
        iVar11 = 1;
        goto LAB_006ce7b7;
      }
      uVar14 = uVar14 + 1;
    } while (uVar6 != uVar14);
  }
  iVar11 = 0;
LAB_006ce7b7:
  p->fStopped = iVar11;
  if ((char)iVar11 == '\0') {
    Gia_ManAreCubeProcess(p,pSta);
    iVar11 = clock_gettime(3,&local_40);
    if (iVar11 < 0) {
      iVar11 = -1;
    }
    else {
      iVar11 = (int)(local_40.tv_nsec / 1000) + (int)local_40.tv_sec * 1000000;
    }
    p->timeCube = p->timeCube + iVar11 + iVar5;
    return p->fStopped;
  }
  if (p->pTarget != (Gia_StaAre_t *)0x0) {
    __assert_fail("p->pTarget == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                  ,0x617,"int Gia_ManAreDeriveNexts_rec(Gia_ManAre_t *, Gia_PtrAre_t)");
  }
  p->pTarget = pSta;
  return 1;
}

Assistant:

int Gia_ManAreDeriveNexts_rec( Gia_ManAre_t * p, Gia_PtrAre_t Sta )
{
    Gia_Obj_t * pPivot;
    Vec_Int_t * vLits, * vTfos;
    Gia_Obj_t * pObj;
    int i;
    abctime clk;
    if ( ++p->nRecCalls == MAX_CALL_NUM )
        return 0;
    if ( (pPivot = Gia_ManAreMostUsedPi(p)) == NULL )
    {
        Gia_StaAre_t * pNew;
        clk = Abc_Clock();
        pNew = Gia_ManAreCreateStaNew( p );
        pNew->iPrev = Sta;
        p->fStopped = (p->fMiter && (Gia_ManCheckPOstatus(p) & 1));
        if ( p->fStopped )
        {
            assert( p->pTarget == NULL );
            p->pTarget = pNew;
            return 1;
        }
        Gia_ManAreCubeProcess( p, pNew );
        p->timeCube += Abc_Clock() - clk;
        return p->fStopped;
    }
    // remember values in the cone and perform update
    vTfos = Vec_VecEntryInt( p->vCiTfos, Gia_ObjCioId(pPivot) );
    vLits = Vec_VecEntryInt( p->vCiLits, Gia_ObjCioId(pPivot) );
    assert( Vec_IntSize(vTfos) == Vec_IntSize(vLits) );
    Gia_ManForEachObjVec( vTfos, p->pAig, pObj, i )
    {
        Vec_IntWriteEntry( vLits, i, pObj->Value );
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( p->pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        else 
        {
            assert( Gia_ObjIsCi(pObj) );
            pObj->Value = 0;
        }
    }
    if ( Gia_ManAreDeriveNexts_rec( p, Sta ) )
        return 1;
    // compute different values
    Gia_ManForEachObjVec( vTfos, p->pAig, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( p->pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        else 
        {
            assert( Gia_ObjIsCi(pObj) );
            pObj->Value = 1;
        }
    }
    if ( Gia_ManAreDeriveNexts_rec( p, Sta ) )
        return 1;
    // reset the original values
    Gia_ManForEachObjVec( vTfos, p->pAig, pObj, i )
        pObj->Value = Vec_IntEntry( vLits, i );
    return 0;
}